

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O2

int check_fs(test_state *state)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  long lVar4;
  
  iVar1 = state->bytes_per_sample;
  lVar4 = (long)iVar1;
  puVar2 = state->ubuf;
  if ((state->strm->flags & 8) == 0) {
    for (puVar3 = puVar2; puVar3 < puVar2 + state->buf_len; puVar3 = puVar3 + lVar4 * 4) {
      (*state->out)(puVar3,0,iVar1);
      (*state->out)(puVar3 + lVar4,0,iVar1);
      (*state->out)(puVar3 + iVar1 * 2,0,iVar1);
      (*state->out)(puVar3 + iVar1 * 3,4,iVar1);
      puVar2 = state->ubuf;
    }
  }
  else {
    for (puVar3 = puVar2; puVar3 < puVar2 + state->buf_len; puVar3 = puVar3 + iVar1 * 4) {
      (*state->out)(puVar3,state->xmin + 2,iVar1);
      (*state->out)(puVar3 + lVar4,state->xmin,iVar1);
      (*state->out)(puVar3 + iVar1 * 2,state->xmin,iVar1);
      (*state->out)(puVar3 + iVar1 * 3,state->xmin,iVar1);
      puVar2 = state->ubuf;
    }
  }
  printf("Checking FS ... ");
  iVar1 = check_block_sizes(state,1,state->id_len);
  if (iVar1 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
  }
  return iVar1;
}

Assistant:

int check_fs(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, state->xmin + 2, size);
            state->out(tmp + size, state->xmin, size);
            state->out(tmp + 2 * size, state->xmin, size);
            state->out(tmp + 3 * size, state->xmin, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, 0, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, 4, size);
        }
    }

    printf("Checking FS ... ");
    status = check_block_sizes(state, 1, state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}